

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutable_s2shape_index.h
# Opt level: O2

void __thiscall MutableS2ShapeIndex::UpdateState::~UpdateState(UpdateState *this)

{
  S2LogMessage local_10;
  
  if (this->num_waiting == 0) {
    return;
  }
  S2LogMessage::S2LogMessage
            (&local_10,
             "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/mutable_s2shape_index.h"
             ,0x1da,kFatal,(ostream *)&std::cerr);
  std::operator<<(local_10.stream_,"Check failed: (0) == (num_waiting) ");
  abort();
}

Assistant:

~UpdateState() {
      S2_DCHECK_EQ(0, num_waiting);
    }